

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_maximal_dimension<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
               (Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true>_>
                *m)

{
  Underlying_matrix *this;
  Dictionary *this_00;
  uint uVar1;
  uint uVar2;
  undefined4 local_140;
  int local_13c;
  undefined4 *local_138;
  int *local_130;
  initializer_list<unsigned_int> local_128;
  undefined8 *local_118;
  int **local_110;
  initializer_list<unsigned_int> local_108;
  undefined8 *local_f8;
  undefined4 **local_f0;
  undefined1 local_e8;
  undefined8 local_e0;
  shared_count sStack_d8;
  undefined **local_d0;
  undefined1 local_c8;
  undefined8 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x39f);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00230130;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_13c = (m->matrix_).super_Matrix_dimension_option.maxDim_;
  local_130 = &local_13c;
  local_138 = &local_140;
  local_140 = 2;
  local_e8 = local_13c == 2;
  local_e0 = 0;
  sStack_d8.pi_ = (sp_counted_base *)0x0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_a8 = "";
  local_110 = &local_130;
  local_128._M_len = local_128._M_len & 0xffffffffffffff00;
  local_128._M_array = (iterator)&PTR__lazy_ostream_002300f0;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_108._M_len = local_108._M_len & 0xffffffffffffff00;
  local_f0 = &local_138;
  local_108._M_array = (iterator)&PTR__lazy_ostream_002300f0;
  local_f8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d8);
  local_128._M_array = (iterator)0x100000000;
  local_128._M_len = 0x300000002;
  local_118 = (undefined8 *)0x500000004;
  local_108._M_len = 6;
  uVar1 = (m->matrix_).nextIndex_;
  this_00 = &(m->matrix_).pivotToColumnIndex_;
  local_108._M_array = (iterator)&local_128;
  if ((ulong)((long)(m->matrix_).pivotToColumnIndex_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(m->matrix_).pivotToColumnIndex_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) <= (ulong)uVar1) {
    local_d0 = (undefined **)CONCAT44(local_d0._4_4_,0xffffffff);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (this_00,(ulong)(uVar1 * 2 + 1),(value_type_conflict *)&local_d0);
  }
  uVar2 = 0;
  if (local_108._M_len != 0) {
    uVar2 = (int)local_108._M_len - 1;
  }
  this = &m->matrix_;
  Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_up
            (&this->super_Matrix_dimension_option,uVar2);
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
  ::_reduce_boundary<std::initializer_list<unsigned_int>>
            (&local_88,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
              *)this,uVar1,&local_108,-1);
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_108._M_array = (iterator)0x100000000;
  local_108._M_len = 0x300000002;
  local_128._M_len = 4;
  uVar1 = (m->matrix_).nextIndex_;
  local_128._M_array = (iterator)&local_108;
  if ((ulong)((long)(m->matrix_).pivotToColumnIndex_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(m->matrix_).pivotToColumnIndex_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) <= (ulong)uVar1) {
    local_d0 = (undefined **)CONCAT44(local_d0._4_4_,0xffffffff);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (this_00,(ulong)(uVar1 * 2 + 1),(value_type_conflict *)&local_d0);
  }
  uVar2 = 0;
  if (local_128._M_len != 0) {
    uVar2 = (int)local_128._M_len - 1;
  }
  Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_up
            (&this->super_Matrix_dimension_option,uVar2);
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
  ::_reduce_boundary<std::initializer_list<unsigned_int>>
            (&local_a0,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
              *)this,uVar1,&local_128,-1);
  if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x3a9);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00230130;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_13c = (m->matrix_).super_Matrix_dimension_option.maxDim_;
  local_e8 = local_13c == 5;
  local_140 = 5;
  local_e0 = 0;
  sStack_d8.pi_ = (sp_counted_base *)0x0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_a8 = "";
  local_130 = &local_13c;
  local_128._M_len = local_128._M_len & 0xffffffffffffff00;
  local_128._M_array = (iterator)&PTR__lazy_ostream_002300f0;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_110 = &local_130;
  local_138 = &local_140;
  local_108._M_len = local_108._M_len & 0xffffffffffffff00;
  local_108._M_array = (iterator)&PTR__lazy_ostream_002300f0;
  local_f8 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_138;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d8);
  return;
}

Assistant:

void test_maximal_dimension(Matrix& m) {
  BOOST_CHECK_EQUAL(m.get_max_dimension(), 2);

  if constexpr (Matrix::Option_list::is_z2) {
    m.insert_boundary({0, 1, 2, 3, 4, 5});
    m.insert_boundary({0, 1, 2, 3});
  } else {
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}, {4, 1}, {5, 4}});
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}});
  }

  BOOST_CHECK_EQUAL(m.get_max_dimension(), 5);

  if constexpr (Matrix::Option_list::has_vine_update &&
                (Matrix::Option_list::is_of_boundary_type ||
                 (Matrix::Option_list::has_map_column_container && Matrix::Option_list::has_column_pairings))) {
    m.remove_maximal_cell(7);
    BOOST_CHECK_EQUAL(m.get_max_dimension(), 3);
  }
}